

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool cmState::StringToCacheEntryType(string *s,CacheEntryType *type)

{
  pointer __s1;
  size_t __n;
  int iVar1;
  size_type *psVar2;
  ulong uVar3;
  bool bVar4;
  
  __s1 = (s->_M_dataplus)._M_p;
  __n = s->_M_string_length;
  bVar4 = true;
  psVar2 = &cmCacheEntryTypes_abi_cxx11_._M_elems[0]._M_string_length;
  uVar3 = 0;
  while ((__n != *psVar2 ||
         ((__n != 0 &&
          (iVar1 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (psVar2 + -1))->_M_dataplus)._M_p,__n), iVar1 != 0))))) {
    bVar4 = uVar3 < 6;
    uVar3 = uVar3 + 1;
    psVar2 = psVar2 + 4;
    if (uVar3 == 7) {
      return bVar4;
    }
  }
  *type = (CacheEntryType)uVar3;
  return bVar4;
}

Assistant:

bool cmState::StringToCacheEntryType(const std::string& s,
                                     cmStateEnums::CacheEntryType& type)
{
  for (size_t i = 0; i < cmCacheEntryTypes.size(); ++i) {
    if (s == cmCacheEntryTypes[i]) {
      type = static_cast<cmStateEnums::CacheEntryType>(i);
      return true;
    }
  }
  return false;
}